

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

nn_trie_node ** nn_node_next(nn_trie_node *self,uint8_t c)

{
  nn_trie_node **ppnVar1;
  uint local_20;
  int i;
  uint8_t c_local;
  nn_trie_node *self_local;
  
  if (self->type == '\0') {
    self_local = (nn_trie_node *)0x0;
  }
  else if (self->type < 9) {
    for (local_20 = 0; local_20 != self->type; local_20 = local_20 + 1) {
      if (self->prefix[(long)(int)local_20 + 10] == c) {
        ppnVar1 = nn_node_child(self,local_20);
        return ppnVar1;
      }
    }
    self_local = (nn_trie_node *)0x0;
  }
  else if ((c < (self->u).sparse.children[0]) || ((self->u).sparse.children[1] < c)) {
    self_local = (nn_trie_node *)0x0;
  }
  else {
    self_local = (nn_trie_node *)nn_node_child(self,(uint)c - (uint)(self->u).sparse.children[0]);
  }
  return (nn_trie_node **)self_local;
}

Assistant:

struct nn_trie_node **nn_node_next (struct nn_trie_node *self, uint8_t c)
{
    /*  Finds the pointer to the next node based on the supplied character.
        If there is no such pointer, it returns NULL. */

    int i;

    if (self->type == 0)
        return NULL;

    /*  Sparse mode. */
    if (self->type <= 8) {
        for (i = 0; i != self->type; ++i)
            if (self->u.sparse.children [i] == c)
                return nn_node_child (self, i);
        return NULL;
    }

    /*  Dense mode. */
    if (c < self->u.dense.min || c > self->u.dense.max)
        return NULL;
    return nn_node_child (self, c - self->u.dense.min);
}